

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float4 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  Property *prop;
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 uVar6;
  int iVar7;
  uint32_t uVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  long *plVar11;
  const_iterator cVar12;
  long *plVar13;
  mapped_type *pmVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  _Base_ptr p_Var16;
  Property *args;
  undefined8 __n;
  ulong __n_00;
  size_t __n_01;
  size_t i;
  ulong uVar17;
  char cVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer pcVar20;
  char *pcVar21;
  _Alloc_hider _Var22;
  Property *prop_00;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *args_2;
  size_t sVar23;
  long lVar24;
  anon_struct_8_0_00000001_for___align aVar25;
  _Base_ptr p_Var26;
  byte bVar27;
  bool bVar28;
  bool bVar29;
  string attr_type_name;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  Animatable<std::array<float,_4UL>_> dst;
  optional<std::array<float,_4UL>_> pv;
  optional<tinyusdz::Animatable<std::array<float,_4UL>_>_> av;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 local_638 [16];
  undefined1 local_628 [24];
  undefined1 local_610 [8];
  _Alloc_hider local_608;
  undefined1 local_600 [8];
  undefined1 auStack_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  _Base_ptr local_5c8;
  undefined1 local_5c0 [7];
  undefined1 uStack_5b9;
  undefined7 uStack_5b8;
  undefined1 uStack_5b1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5b0;
  UsdPrimvarReader_float4 *local_5a0;
  _Base_ptr local_598;
  AttrMetas *local_590;
  AttrMetas *local_588;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *local_580;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  undefined4 *local_528;
  undefined8 local_520;
  undefined4 local_518;
  undefined2 uStack_514;
  undefined1 uStack_512;
  undefined1 uStack_511;
  undefined1 local_508 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8;
  undefined7 uStack_4e7;
  undefined1 uStack_4e0;
  undefined7 uStack_4df;
  undefined1 uStack_4d8;
  ios_base local_498 [280];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_380;
  undefined1 local_378 [32];
  ulong local_358;
  undefined1 local_350 [24];
  storage_t<std::array<float,_4UL>_> local_338;
  optional<std::array<float,_4UL>_> local_328;
  string local_310 [16];
  undefined8 local_300 [2];
  undefined1 local_2f0 [32];
  key_type local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  undefined1 local_290 [40];
  storage_union sStack_268;
  undefined1 local_258 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_240;
  ios_base aiStack_230 [8];
  bool local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [32];
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [2];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [48];
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [24];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  sStack_f8;
  size_t local_c8;
  storage_t<tinyusdz::Token> sStack_c0;
  undefined1 local_a0 [32];
  undefined1 local_80 [80];
  
  local_578._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_578._M_impl.super__Rb_tree_header._M_header;
  local_578._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_578._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_578._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop_00 = (Property *)warn;
  args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)err;
  local_5a0 = preader;
  local_578._M_impl.super__Rb_tree_header._M_header._M_right =
       local_578._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = &aStack_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &aStack_2a0) {
    operator_delete((void *)local_2b0._0_8_,aStack_2a0._M_allocated_capacity + 1);
  }
  p_Var16 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_378._16_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  bVar27 = p_Var16 == (_Base_ptr)local_378._16_8_;
  if (!(bool)bVar27) {
    local_590 = &(local_5a0->fallback)._metas;
    local_378._8_8_ = &(local_5a0->fallback)._paths;
    local_498._272_8_ = &(local_5a0->fallback)._attrib;
    local_580 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_5a0->varname;
    local_588 = &(local_5a0->result)._metas;
    local_498._264_8_ = &(local_5a0->result)._actual_type_name;
    local_380 = &(local_5a0->super_ShaderNode).super_UsdShadePrim.props;
    local_5c8 = p_Var16;
    local_378._0_8_ = warn;
    do {
      p_Var16 = local_5c8;
      local_548._M_allocated_capacity = (size_type)&local_538;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_548,*(long *)(local_5c8 + 1),
                 (long)&(local_5c8[1]._M_parent)->_M_color + *(long *)(local_5c8 + 1));
      local_5e8._M_allocated_capacity = (size_type)&local_5d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_5f8 + 0x10),"inputs:fallback","");
      uVar4 = local_548._8_8_;
      uVar3 = local_5e8._8_8_;
      local_608._M_p = auStack_5f8;
      local_600 = (undefined1  [8])0x0;
      auStack_5f8._0_8_ = auStack_5f8._0_8_ & 0xffffffffffffff00;
      __n = local_548._8_8_;
      if ((ulong)local_5e8._8_8_ < (ulong)local_548._8_8_) {
        __n = local_5e8._8_8_;
      }
      if (__n == 0) {
        bVar28 = true;
      }
      else {
        iVar7 = bcmp((void *)local_548._M_allocated_capacity,(void *)local_5e8._M_allocated_capacity
                     ,__n);
        bVar28 = iVar7 == 0;
      }
      prop = (Property *)(p_Var16 + 2);
      if ((bool)(bVar28 ^ 1U | uVar4 != uVar3)) {
        local_610._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var16[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_610._0_4_ = 7;
          local_508 = (undefined1  [8])local_4f8;
          local_638._0_8_ = &DAT_0000003e;
          local_508 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_508,(ulong)local_638);
          local_4f8._0_8_ = local_638._0_8_;
          builtin_strncpy((char *)local_508,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_638._0_8_;
          *(char *)((long)local_508 + local_638._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_508,(string *)(auStack_5f8 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_638._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_608,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &aStack_2a0) {
            operator_delete((void *)local_2b0._0_8_,aStack_2a0._M_allocated_capacity + 1);
          }
          if (local_508 != (undefined1  [8])local_4f8) {
            operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
          }
        }
        if (p_Var16[6]._M_left != p_Var16[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_378._8_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var16[6]._M_parent);
          local_610 = (undefined1  [8])((ulong)local_610 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_638,(Attribute *)prop);
        local_2b0._0_8_ = &aStack_2a0;
        local_2b0[8] = true;
        local_2b0._9_3_ = 0;
        local_2b0._12_4_ = (storage_t<unsigned_int>)0x0;
        aStack_2a0._M_allocated_capacity._0_7_ = 0x3474616f6c66;
        if ((pointer)local_638._8_8_ == (pointer)0x6) {
          bVar28 = (short)*(int *)(local_638._0_8_ + 4) == 0x3474 &&
                   *(int *)local_638._0_8_ == 0x616f6c66;
        }
        else {
          bVar28 = false;
        }
        bVar29 = true;
        if (!bVar28) {
          local_528 = &local_518;
          uStack_514 = 0x3474;
          local_518 = 0x616f6c66;
          local_520 = 6;
          uStack_512 = 0;
          if ((pointer)local_638._8_8_ == (pointer)0x6) {
            bVar29 = (short)*(int *)(local_638._0_8_ + 4) == 0x3474 &&
                     *(int *)local_638._0_8_ == 0x616f6c66;
          }
          else {
            bVar29 = false;
          }
        }
        if ((!bVar28) && (local_528 != &local_518)) {
          operator_delete(local_528,
                          CONCAT17(uStack_511,CONCAT16(uStack_512,CONCAT24(uStack_514,local_518))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &aStack_2a0) {
          operator_delete((void *)local_2b0._0_8_,aStack_2a0._M_allocated_capacity + 1);
        }
        if (bVar29) {
          iVar7 = *(int *)((long)&p_Var16[0x17]._M_parent + 4);
          if (iVar7 != 1) {
            if (iVar7 == 0) {
              (local_5a0->fallback)._value_empty = true;
              AttrMetas::operator=(local_590,(AttrMetas *)(p_Var16 + 7));
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(auStack_5f8 + 0x10);
LAB_00238e73:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_578,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar19);
              local_610 = (undefined1  [8])((ulong)local_610 & 0xffffffff00000000);
            }
            else {
              prop_00 = (Property *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_608,0,(char *)local_600,0x3bcc94);
              local_610._0_4_ = 8;
            }
            goto LAB_00238e80;
          }
          if (p_Var16[5]._M_left == p_Var16[5]._M_parent) {
            if (p_Var16[4]._M_right == (_Base_ptr)0x0) {
              bVar28 = false;
            }
            else {
              iVar7 = (**(code **)p_Var16[4]._M_right)();
              bVar28 = iVar7 == 4;
            }
            if ((bVar28) || ((p_Var16[5]._M_color & _S_black) != _S_red)) {
              (local_5a0->fallback)._blocked = true;
            }
          }
          if (((char)p_Var16[5]._M_color == _S_red) &&
             ((((p_Var16[4]._M_right != (_Base_ptr)0x0 &&
                (iVar7 = (**(code **)p_Var16[4]._M_right)(), iVar7 == 0)) ||
               ((p_Var16[4]._M_right != (_Base_ptr)0x0 &&
                (iVar7 = (**(code **)p_Var16[4]._M_right)(), iVar7 == 1)))) &&
              (p_Var16[5]._M_left == p_Var16[5]._M_parent)))) {
            bVar28 = true;
            bVar29 = false;
          }
          else {
            uStack_4e0 = 0;
            uStack_4df = 0;
            uStack_4d8 = 0;
            local_4f8._8_8_ = (void *)0x0;
            local_4e8 = Varying;
            uStack_4e7 = 0;
            local_508 = (undefined1  [8])0x0;
            pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffff0000;
            bVar28 = primvar::PrimVar::is_valid((PrimVar *)&p_Var16[4]._M_parent);
            if (bVar28) {
              if (((char)p_Var16[5]._M_color == _S_red) &&
                 (((p_Var16[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar7 = (**(code **)p_Var16[4]._M_right)(), iVar7 == 0)) ||
                  ((p_Var16[4]._M_right != (_Base_ptr)0x0 &&
                   (iVar7 = (**(code **)p_Var16[4]._M_right)(), iVar7 == 1)))))) {
                uVar6 = '\0';
              }
              else {
                primvar::PrimVar::get_value<std::array<float,4ul>>
                          ((optional<std::array<float,_4UL>_> *)(local_350 + 0x14),
                           (PrimVar *)&p_Var16[4]._M_parent);
                uVar6 = local_350[0x14];
                if (local_350[0x14] == '\x01') {
                  local_328._3_1_ = SUB81(local_338._0_8_,0);
                  local_328.contained._0_7_ = (undefined7)((ulong)local_338._0_8_ >> 8);
                  local_328.contained._7_1_ = (undefined1)local_338._8_8_;
                  local_328.contained._8_7_ = (undefined7)((ulong)local_338._8_8_ >> 8);
                  local_508 = (undefined1  [8])local_338._0_8_;
                  pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_338._8_8_;
                  local_4f8._0_2_ = 1;
                }
              }
              if (p_Var16[5]._M_left == p_Var16[5]._M_parent) {
                if (uVar6 == '\0') goto LAB_00238b06;
              }
              else {
                p_Var26 = (_Base_ptr)&p_Var16[5]._M_parent;
                lVar24 = 0;
                uVar17 = 0;
                local_598 = p_Var26;
                do {
                  if ((char)p_Var16[6]._M_color == _S_black) {
                    tinyusdz::value::TimeSamples::update((TimeSamples *)p_Var26);
                  }
                  lVar2 = *(long *)p_Var26;
                  if (*(char *)(lVar2 + 0x20 + lVar24) == '\x01') {
                    TypedTimeSamples<std::array<float,_4UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_4UL>_> *)(local_4f8 + 8),
                               *(double *)(lVar2 + lVar24));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,4ul>>
                              (&local_328,(Value *)(lVar24 + lVar2 + 8),false);
                    bVar28 = local_328.has_value_;
                    local_350[0x14] = local_328.has_value_;
                    if (local_328.has_value_ == true) {
                      local_338._0_8_ =
                           CONCAT17(local_328.contained._7_1_,local_328.contained._0_7_);
                      local_338._8_8_ =
                           CONCAT17(local_328.contained._15_1_,local_328.contained._8_7_);
                      TypedTimeSamples<std::array<float,_4UL>_>::add_sample
                                ((TypedTimeSamples<std::array<float,_4UL>_> *)(local_4f8 + 8),
                                 *(double *)(lVar2 + lVar24),(array<float,_4UL> *)&local_338);
                    }
                    else {
                      uStack_5b9 = 0;
                      uStack_5b8 = 0;
                      uStack_5b1 = 0;
                      aStack_5b0._M_allocated_capacity._0_7_ = 0;
                      aStack_5b0._M_local_buf[7] = '\0';
                      aStack_5b0._M_local_buf[8] = '\0';
                      aStack_5b0._9_6_ = 0;
                    }
                    p_Var26 = local_598;
                    if (bVar28 == false) goto LAB_00238b11;
                  }
                  uVar17 = uVar17 + 1;
                  lVar24 = lVar24 + 0x28;
                  p_Var16 = local_5c8;
                } while (uVar17 < (ulong)(((long)local_5c8[5]._M_left - (long)local_5c8[5]._M_parent
                                          >> 3) * -0x3333333333333333));
              }
              aVar25 = (anon_struct_8_0_00000001_for___align)local_4f8._8_8_;
              aStack_5b0._M_local_buf[7] = (char)local_4f8._0_8_;
              aStack_5b0._M_local_buf[8] = SUB81(local_4f8._0_8_,1);
              uStack_5b9 = local_508[0];
              uStack_5b8 = local_508._1_7_;
              uStack_5b1 = SUB81(pbStack_500,0);
              aStack_5b0._M_allocated_capacity._0_7_ = (undefined7)((ulong)pbStack_500 >> 8);
              p_Var16 = (_Base_ptr)CONCAT71(uStack_4e7,local_4e8);
              sVar23 = CONCAT71(uStack_4df,uStack_4e0);
              local_4f8._8_8_ = (void *)0x0;
              local_4e8 = Varying;
              uStack_4e7 = 0;
              uStack_4e0 = 0;
              uStack_4df = 0;
              cVar18 = '\x01';
              uVar6 = uStack_4d8;
            }
            else {
LAB_00238b06:
              uStack_5b9 = 0;
              uStack_5b8 = 0;
              uStack_5b1 = 0;
              aStack_5b0._M_allocated_capacity._0_7_ = 0;
              aStack_5b0._M_local_buf[7] = '\0';
              aStack_5b0._M_local_buf[8] = '\0';
              aStack_5b0._9_6_ = 0;
LAB_00238b11:
              aVar25 = (anon_struct_8_0_00000001_for___align)0x0;
              p_Var16 = (_Base_ptr)0x0;
              sVar23 = 0;
              uVar6 = 0;
              cVar18 = '\0';
            }
            if ((void *)local_4f8._8_8_ != (void *)0x0) {
              operator_delete((void *)local_4f8._8_8_,
                              CONCAT71(uStack_4df,uStack_4e0) - local_4f8._8_8_);
            }
            local_2b0[0] = cVar18;
            if (cVar18 != '\0') {
              aStack_2a0._8_2_ = CONCAT11(aStack_5b0._M_local_buf[8],aStack_5b0._M_local_buf[7]);
              local_2b0._9_7_ = uStack_5b8;
              local_2b0[8] = uStack_5b9;
              aStack_2a0._M_allocated_capacity =
                   CONCAT71(aStack_5b0._M_allocated_capacity._0_7_,uStack_5b1);
              local_290[0x18] = uVar6;
              local_290._0_8_ = aVar25;
              local_290._8_8_ = p_Var16;
              local_290._16_8_ = sVar23;
            }
            if (cVar18 == '\x01') {
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,4ul>>>::
              operator=((optional<tinyusdz::Animatable<std::array<float,4ul>>> *)local_498._272_8_,
                        (Animatable<std::array<float,_4UL>_> *)(local_2b0 + 8));
            }
            else {
              local_610._0_4_ = 8;
              prop_00 = (Property *)0x55;
              ::std::__cxx11::string::_M_replace((ulong)&local_608,0,(char *)local_600,0x3bcf62);
            }
            p_Var16 = local_5c8;
            if (((ostringstream)local_2b0[0] == (ostringstream)0x1) &&
               ((anon_struct_8_0_00000001_for___align)local_290._0_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0)) {
              operator_delete((void *)local_290._0_8_,local_290._16_8_ - local_290._0_8_);
            }
            if (cVar18 != '\0') {
              AttrMetas::operator=(local_590,(AttrMetas *)(p_Var16 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_578,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_5f8 + 0x10));
              local_610 = (undefined1  [8])((ulong)local_610 & 0xffffffff00000000);
            }
            bVar29 = true;
            bVar28 = false;
          }
          if (bVar28) {
            if (p_Var16[6]._M_left != p_Var16[6]._M_parent) {
              AttrMetas::operator=(local_590,(AttrMetas *)(p_Var16 + 7));
              paVar19 = &local_548;
              goto LAB_00238e73;
            }
            goto LAB_00238e80;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628) {
            operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
          }
          if ((bVar29) ||
             (pcVar20 = (pointer)auStack_5f8._0_8_, _Var22._M_p = local_608._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._M_p ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f8))
          goto LAB_00238e97;
        }
        else {
          local_610._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)aStack_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)aStack_2a0._M_local_buf,
                              (char *)local_5e8._M_allocated_capacity,local_5e8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
          pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
          local_4f8._0_7_ = 0x3474616f6c66;
          local_508 = (undefined1  [8])local_4f8;
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_4f8,6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"` but defined as type `",0x17);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_638._0_8_,local_638._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
          if (local_508 != (undefined1  [8])local_4f8) {
            operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_608,(string *)local_508);
          if (local_508 != (undefined1  [8])local_4f8) {
            operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
LAB_00238e80:
          pcVar20 = (pointer)local_628._0_8_;
          _Var22._M_p = (pointer)local_638._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628)
          goto LAB_00238e97;
        }
        operator_delete(_Var22._M_p,(ulong)(pcVar20 + 1));
      }
LAB_00238e97:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_allocated_capacity != &local_5d8) {
        operator_delete((void *)local_5e8._M_allocated_capacity,local_5d8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_allocated_capacity != &local_538) {
        operator_delete((void *)local_548._M_allocated_capacity,local_538._M_allocated_capacity + 1)
        ;
      }
      iVar7 = 0;
      if (((ulong)local_610 & 0xfffffffd) == 0) {
        iVar7 = 3;
LAB_00239118:
        bVar28 = false;
      }
      else {
        bVar28 = true;
        if (local_610._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x10f2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_638._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_638,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_508,(fmt *)local_638,(string *)"inputs:fallback",
                     (char (*) [16])&local_608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2b0,(char *)local_508,(long)pbStack_500);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if (local_508 != (undefined1  [8])local_4f8) {
            operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628) {
            operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar10 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_638,(ulong)(err->_M_dataplus)._M_p);
            pcVar21 = (char *)(puVar10 + 2);
            if ((char *)*puVar10 == pcVar21) {
              local_4f8._0_8_ = *(undefined8 *)pcVar21;
              local_4f8._8_8_ = puVar10[3];
              local_508 = (undefined1  [8])local_4f8;
            }
            else {
              local_4f8._0_8_ = *(undefined8 *)pcVar21;
              local_508 = (undefined1  [8])*puVar10;
            }
            pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          puVar10[1];
            *puVar10 = pcVar21;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_508);
            if (local_508 != (undefined1  [8])local_4f8) {
              operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628) {
              operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          iVar7 = 1;
          goto LAB_00239118;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f8) {
        operator_delete(local_608._M_p,(ulong)(auStack_5f8._0_8_ + 1));
      }
      if (bVar28) {
        local_598 = local_5c8 + 1;
        iVar7 = ::std::__cxx11::string::compare((char *)local_598);
        if (iVar7 == 0) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"inputs:varname","");
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_578,&local_2d0);
          bVar28 = (_Rb_tree_header *)cVar12._M_node == &local_578._M_impl.super__Rb_tree_header;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar28 = false;
        }
        p_Var16 = local_5c8;
        if (bVar28) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_8_ = ((ulong)local_2b0._8_8_ >> 8 & 0xffffff) << 8;
          aStack_2a0._M_allocated_capacity = aStack_2a0._M_allocated_capacity & 0xffffffffffff0000;
          aStack_2a0._8_2_ = aStack_2a0._8_2_ & 0xff00;
          local_220._M_allocated_capacity = 0;
          local_220._M_local_buf[8] = '\0';
          local_110._16_8_ = 0;
          sStack_f8._0_8_ = 0;
          local_110._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          sStack_f8._16_4_ = 0;
          sStack_f8._24_8_ = 0;
          sStack_268._8_1_ = false;
          local_290._32_8_ = (pointer)0x0;
          sStack_268.dynamic = (pointer)0x0;
          local_290._16_8_ = 0;
          local_290._24_8_ = (pointer)0x0;
          local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._8_8_ = (_Base_ptr)0x0;
          local_228 = false;
          aStack_240._8_8_ = 0;
          aiStack_230 = (ios_base  [8])0x0;
          local_258._16_8_ = 0;
          aStack_240._M_allocated_capacity = 0;
          local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_258._8_8_ = (pointer)0x0;
          local_1f0[0] = false;
          local_210._16_8_ = 0;
          local_210._24_8_ = 0;
          local_210._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = 0;
          aaStack_1e0[1]._8_1_ = false;
          aaStack_1e0[0]._8_8_ = 0;
          aaStack_1e0[1]._0_8_ = (pointer)0x0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aaStack_1e0[0]._M_allocated_capacity = 0;
          local_1a0[0] = '\0';
          local_1c0._16_8_ = (pointer)0x0;
          local_1c0._24_8_ = 0;
          local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = false;
          local_1a0._40_8_ = (pointer)0x0;
          auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._24_8_ = 0;
          local_1a0._32_8_ = (pointer)0x0;
          local_1a0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0[0x10] = false;
          local_1a0._17_3_ = 0;
          local_1a0._20_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
          auStack_148[8] = 0;
          auStack_170._32_8_ = 0;
          auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[0x10] = false;
          auStack_170._17_3_ = 0;
          auStack_170._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          auStack_170[0x18] = false;
          auStack_170._25_3_ = 0;
          auStack_170._28_4_ = (storage_t<unsigned_int>)0x0;
          local_138[0x20] = 0;
          local_138._16_8_ = 0;
          local_138._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._8_8_ = 0;
          sStack_f8._32_8_ = (long)&sStack_f8 + 0x10;
          sStack_c0._24_1_ = 0;
          sStack_c0._8_8_ = 0;
          sStack_c0._16_8_ = 0;
          local_c8 = 0;
          sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = 0;
          local_a0._17_8_ = 0;
          local_a0._0_8_ = (pointer)0x0;
          local_a0[8] = 0;
          local_a0._9_7_ = 0;
          local_80[0x40] = 0;
          local_80._65_8_ = 0;
          local_80._48_8_ = 0;
          local_80[0x38] = 0;
          local_80._57_7_ = 0;
          local_80._32_8_ = 0;
          local_80._40_8_ = 0;
          local_80._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._24_8_ = 0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = 0;
          local_2f0._0_8_ = (long)local_2f0 + 0x10;
          sStack_f8._40_8_ = sStack_f8._32_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f0,*(long *)(local_5c8 + 1),
                     (long)&(local_5c8[1]._M_parent)->_M_color + *(long *)(local_5c8 + 1));
          prop_00 = (Property *)local_508;
          local_508 = (undefined1  [8])local_4f8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","");
          args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_610,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_578,(string *)local_2f0,prop,(string *)prop_00,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          if (local_508 != (undefined1  [8])local_4f8) {
            operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
          }
          if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
          }
          if (local_610._0_4_ == 3) {
            local_310._0_8_ = local_300;
            lVar24 = *(long *)(p_Var16 + 1);
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,lVar24,(long)&(p_Var16[1]._M_parent)->_M_color + lVar24);
            prop_00 = (Property *)local_508;
            local_508 = (undefined1  [8])local_4f8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","")
            ;
            args = prop;
            args_2 = local_580;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_638,(_anonymous_namespace_ *)&local_578,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)prop,prop_00,(string *)local_580,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(bVar27,in_stack_fffffffffffff9b8));
            if (local_508 != (undefined1  [8])local_4f8) {
              operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
            }
            if ((undefined8 *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_638._0_4_ == Success) {
              iVar7 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_508,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_508,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_508,0x110b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_5c0 = SUB87(&aStack_5b0,0);
              uStack_5b9 = (undefined1)((ulong)&aStack_5b0 >> 0x38);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)(auStack_5f8 + 0x10),(fmt *)local_5c0,(string *)(local_638 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_508,(char *)local_5e8._M_allocated_capacity,
                                  local_5e8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5e8._M_allocated_capacity != &local_5d8) {
                operator_delete((void *)local_5e8._M_allocated_capacity,
                                local_5d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT17(uStack_5b9,local_5c0) != &aStack_5b0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT17(uStack_5b9,local_5c0),
                                CONCAT17(aStack_5b0._M_local_buf[7],
                                         aStack_5b0._M_allocated_capacity._0_7_) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5c0,(ulong)(err->_M_dataplus)._M_p);
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar19) {
                  local_5d8._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_5d8._8_8_ = plVar11[3];
                  local_5e8._M_allocated_capacity = (size_type)&local_5d8;
                }
                else {
                  local_5d8._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_5e8._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_5e8._8_8_ = plVar11[1];
                *plVar11 = (long)paVar19;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)(auStack_5f8 + 0x10));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e8._M_allocated_capacity != &local_5d8) {
                  operator_delete((void *)local_5e8._M_allocated_capacity,
                                  local_5d8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT17(uStack_5b9,local_5c0) != &aStack_5b0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT17(uStack_5b9,local_5c0),
                                  CONCAT17(aStack_5b0._M_local_buf[7],
                                           aStack_5b0._M_allocated_capacity._0_7_) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
              ::std::ios_base::~ios_base(local_498);
              iVar7 = 1;
            }
            if ((undefined1 *)local_638._8_8_ != local_628 + 8) {
              operator_delete((void *)local_638._8_8_,local_628._8_8_ + 1);
            }
          }
          else {
            iVar7 = 0;
            if (local_610._0_4_ == 0) {
              bVar28 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,
                                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_580);
              iVar7 = 3;
              if (!bVar28) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_508,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_508,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_508,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_508,0x10f9);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_508,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar11 = (long *)::std::__cxx11::string::_M_append
                                              (auStack_5f8 + 0x10,(ulong)(err->_M_dataplus)._M_p);
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar11 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11
                      == pbVar15) {
                    local_628._0_8_ = (pbVar15->_M_dataplus)._M_p;
                    local_628._8_8_ = plVar11[3];
                    local_638._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_628;
                  }
                  else {
                    local_628._0_8_ = (pbVar15->_M_dataplus)._M_p;
                    local_638._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar11;
                  }
                  local_638._8_8_ = plVar11[1];
                  *plVar11 = (long)pbVar15;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_638);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_638._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628
                     ) {
                    operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5e8._M_allocated_capacity != &local_5d8) {
                    operator_delete((void *)local_5e8._M_allocated_capacity,
                                    local_5d8._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
                ::std::ios_base::~ios_base(local_498);
                iVar7 = 1;
              }
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f8) {
            operator_delete(local_608._M_p,(ulong)(auStack_5f8._0_8_ + 1));
          }
          if (local_a0[0x18] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar7 != 0) goto LAB_0023a219;
        }
        local_378._24_8_ = local_350;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_378 + 0x18),*(long *)(local_5c8 + 1),
                   (long)&(local_5c8[1]._M_parent)->_M_color + *(long *)(local_5c8 + 1));
        local_5c0 = SUB87(&aStack_5b0,0);
        uStack_5b9 = (undefined1)((ulong)&aStack_5b0 >> 0x38);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"outputs:result","");
        uVar5 = local_358;
        pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_4f8 + 8);
        local_4f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_4f8._8_8_ = local_4f8._8_8_ & 0xffffffffffffff00;
        uVar17 = CONCAT17(uStack_5b1,uStack_5b8);
        __n_00 = local_358;
        if (uVar17 < local_358) {
          __n_00 = uVar17;
        }
        if (__n_00 == 0) {
          bVar28 = true;
        }
        else {
          iVar7 = bcmp((void *)local_378._24_8_,(void *)CONCAT17(uStack_5b9,local_5c0),__n_00);
          bVar28 = iVar7 == 0;
        }
        if ((bool)(bVar28 ^ 1U | uVar5 != uVar17)) {
          local_508._0_4_ = 1;
        }
        else {
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_578,(key_type *)local_5c0);
          p_Var16 = local_5c8;
          if ((_Rb_tree_header *)cVar12._M_node == &local_578._M_impl.super__Rb_tree_header) {
            if ((*(uint *)((long)&local_5c8[0x17]._M_parent + 4) < 2) &&
               (bVar28 = Attribute::is_connection((Attribute *)prop), bVar28)) {
              local_508._0_4_ = 5;
              prop_00 = (Property *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&pbStack_500,0,(char *)local_4f8._0_8_,0x3bef31);
            }
            else if (*(int *)((long)&p_Var16[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)prop);
              bVar28 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_610 = (undefined1  [8])local_600;
              local_608._M_p = (pointer)0x6;
              local_600._0_7_ = 0x3474616f6c66;
              if (((optional<unsigned_int>)local_2b0._8_8_ == (optional<unsigned_int>)0x6) &&
                 (*(short *)(local_2b0._0_8_ + 4) == 0x3474 && *(int *)local_2b0._0_8_ == 0x616f6c66
                 )) {
                (local_5a0->result)._authored = true;
LAB_0023a3e8:
                AttrMetas::operator=(local_588,(AttrMetas *)(p_Var16 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_578,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5c0);
                local_508 = (undefined1  [8])((ulong)local_508 & 0xffffffff00000000);
              }
              else {
                if (bVar28) {
                  uVar8 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                  if (uVar8 == 0x2b) {
                    (local_5a0->result)._authored = true;
                    ::std::__cxx11::string::_M_assign((string *)local_498._264_8_);
                    goto LAB_0023a3e8;
                  }
                  local_508._0_4_ = 3;
                  local_638._0_8_ = local_628;
                  local_5e8._M_allocated_capacity = 0x61;
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create
                                      ((ulong *)local_638,(ulong)(auStack_5f8 + 0x10));
                  __n_01 = 0x61;
                  pcVar21 = 
                  "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                  ;
                }
                else {
                  local_508._0_4_ = 3;
                  local_638._0_8_ = local_628;
                  local_5e8._M_allocated_capacity = 0x46;
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create
                                      ((ulong *)local_638,(ulong)(auStack_5f8 + 0x10));
                  __n_01 = 0x46;
                  pcVar21 = "Property type mismatch. {} expects type `{}` but defined as type `{}`."
                  ;
                }
                uVar3 = local_5e8._M_allocated_capacity;
                local_638._0_8_ = pbVar15;
                local_628._0_8_ = local_5e8._M_allocated_capacity;
                memcpy(pbVar15,pcVar21,__n_01);
                local_638._8_8_ = uVar3;
                *(char *)((long)&(pbVar15->_M_dataplus)._M_p + uVar3) = '\0';
                local_5e8._M_allocated_capacity = (size_type)&local_5d8;
                local_5e8._8_8_ = 6;
                local_5d8._M_allocated_capacity._0_7_ = 0x3474616f6c66;
                prop_00 = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_610,(fmt *)local_638,(string *)local_5c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_5f8 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           prop_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)args_2);
                ::std::__cxx11::string::operator=((string *)&pbStack_500,(string *)local_610);
                if (local_610 != (undefined1  [8])local_600) {
                  operator_delete((void *)local_610,(ulong)((long)local_600 + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e8._M_allocated_capacity != &local_5d8) {
                  operator_delete((void *)local_5e8._M_allocated_capacity,
                                  local_5d8._M_allocated_capacity + 1);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_638._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628)
                {
                  operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &aStack_2a0) {
                operator_delete((void *)local_2b0._0_8_,aStack_2a0._M_allocated_capacity + 1);
              }
            }
            else {
              prop_00 = (Property *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&pbStack_500,0,(char *)local_4f8._0_8_,0x3bef6a);
              local_508._0_4_ = 6;
            }
          }
          else {
            local_508._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(uStack_5b9,local_5c0) != &aStack_5b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT17(uStack_5b9,local_5c0),
                          CONCAT17(aStack_5b0._M_local_buf[7],aStack_5b0._M_allocated_capacity._0_7_
                                  ) + 1);
        }
        if ((undefined1 *)local_378._24_8_ != local_350) {
          operator_delete((void *)local_378._24_8_,local_350._0_8_ + 1);
        }
        iVar7 = 0;
        if (((ulong)local_508 & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_00239dba:
          bVar28 = false;
        }
        else {
          bVar28 = true;
          if (local_508._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x1111);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            local_638._0_8_ = local_628;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_638,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_610,(fmt *)local_638,(string *)"outputs:result",
                       (char (*) [15])&pbStack_500,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00)
            ;
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,(char *)local_610,(long)local_608._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if (local_610 != (undefined1  [8])local_600) {
              operator_delete((void *)local_610,(ulong)((long)local_600 + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628) {
              operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          (local_638,(ulong)(err->_M_dataplus)._M_p);
              plVar11 = plVar13 + 2;
              if ((long *)*plVar13 == plVar11) {
                local_600 = (undefined1  [8])*plVar11;
                auStack_5f8._0_8_ = plVar13[3];
                local_610 = (undefined1  [8])local_600;
              }
              else {
                local_600 = (undefined1  [8])*plVar11;
                local_610 = (undefined1  [8])*plVar13;
              }
              local_608._M_p = (pointer)plVar13[1];
              *plVar13 = (long)plVar11;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_610);
              if (local_610 != (undefined1  [8])local_600) {
                operator_delete((void *)local_610,(ulong)((long)local_600 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_638._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628) {
                operator_delete((void *)local_638._0_8_,(ulong)(local_628._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
            iVar7 = 1;
            goto LAB_00239dba;
          }
        }
        if (pbStack_500 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4f8 + 8)) {
          operator_delete(pbStack_500,local_4f8._8_8_ + 1);
        }
        p_Var16 = local_598;
        if (bVar28) {
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_578,(key_type *)local_598);
          p_Var1 = &local_578._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
            pmVar14 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_380,(key_type *)p_Var16);
            ::std::__cxx11::string::_M_assign((string *)pmVar14);
            p_Var26 = local_5c8;
            (pmVar14->_attrib)._varying_authored = (bool)local_5c8[3].field_0x4;
            (pmVar14->_attrib)._variability = local_5c8[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar14->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar14->_attrib)._var,(any *)&p_Var26[4]._M_parent);
            (pmVar14->_attrib)._var._blocked = SUB41(p_Var26[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&(pmVar14->_attrib)._var._ts,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var26[5]._M_parent);
            (pmVar14->_attrib)._var._ts._dirty = SUB41(p_Var26[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar14->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var26[6]._M_parent);
            AttrMetas::operator=(&(pmVar14->_attrib)._metas,(AttrMetas *)(p_Var26 + 7));
            *(_Base_ptr *)&pmVar14->_listOpQual = p_Var26[0x17]._M_parent;
            (pmVar14->_rel).type = *(Type *)&p_Var26[0x17]._M_left;
            Path::operator=(&(pmVar14->_rel).targetPath,(Path *)&p_Var26[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar14->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var26[0x1e]._M_parent);
            (pmVar14->_rel).listOpQual = p_Var26[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar14->_rel)._metas,(AttrMetas *)&p_Var26[0x1f]._M_parent);
            (pmVar14->_rel)._varying_authored = *(bool *)&p_Var26[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar14->_prop_value_type_name);
            p_Var16 = local_598;
            pmVar14->_has_custom = *(bool *)&p_Var26[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_578,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598);
          }
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_578,(key_type *)p_Var16);
          iVar7 = 0;
          if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x1113);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_508,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var16);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,(char *)local_508,(long)pbStack_500);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if (local_508 != (undefined1  [8])local_4f8) {
              operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
            }
            uVar3 = local_378._0_8_;
            if ((anon_struct_8_0_00000001_for___align)local_378._0_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar10 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_610,(ulong)(err->_M_dataplus)._M_p);
              pcVar21 = (char *)(puVar10 + 2);
              if ((char *)*puVar10 == pcVar21) {
                local_4f8._0_8_ = *(undefined8 *)pcVar21;
                local_4f8._8_8_ = puVar10[3];
                local_508 = (undefined1  [8])local_4f8;
              }
              else {
                local_4f8._0_8_ = *(undefined8 *)pcVar21;
                local_508 = (undefined1  [8])*puVar10;
              }
              pbStack_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            puVar10[1];
              *puVar10 = pcVar21;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar3,(string *)local_508);
              if (local_508 != (undefined1  [8])local_4f8) {
                operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
              }
              if (local_610 != (undefined1  [8])local_600) {
                operator_delete((void *)local_610,(ulong)((long)local_600 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          }
        }
      }
LAB_0023a219:
      if ((iVar7 != 3) && (iVar7 != 0)) break;
      local_5c8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_5c8);
      bVar27 = local_5c8 == (_Base_ptr)local_378._16_8_;
    } while (!(bool)bVar27);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_578,(_Link_type)local_578._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(bVar27 & 1);
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float4>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float4 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float4,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float4, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float4, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}